

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerset.h
# Opt level: O3

bool __thiscall
wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>::join
          (FinitePowersetLattice<wasm::LocalSet_*> *this,Element *joinee,Element *joiner)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  lVar4 = (long)(joiner->bitvector).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar1 = (ulong)(joiner->bitvector).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(joiner->bitvector).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar4) * 8;
  lVar5 = (long)(joinee->bitvector).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if (uVar1 == (ulong)(joinee->bitvector).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
               ((long)(joinee->bitvector).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - lVar5) * 8)
  {
    if (uVar1 == 0) {
      bVar6 = false;
    }
    else {
      uVar7 = 0;
      bVar6 = false;
      do {
        uVar10 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar10 = uVar7;
        }
        uVar8 = (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001);
        uVar9 = 1L << ((byte)uVar7 & 0x3f);
        lVar2 = lVar5 + ((long)uVar10 >> 6) * 8;
        lVar3 = uVar8 * 8 + -8;
        uVar8 = *(ulong *)(lVar2 + -8 + uVar8 * 8);
        if (((uVar8 >> (uVar7 & 0x3f) & 1) == 0) &&
           (uVar10 = *(ulong *)(lVar3 + lVar4 + ((long)uVar10 >> 6) * 8),
           bVar6 = (bool)(bVar6 | (uVar10 & uVar9) != 0), (uVar10 & uVar9) == 0)) {
          uVar8 = uVar8 & ~uVar9;
        }
        else {
          uVar8 = uVar8 | uVar9;
        }
        *(ulong *)(lVar2 + lVar3) = uVar8;
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar1);
    }
    return bVar6;
  }
  __assert_fail("joiner.bitvector.size() == joinee.bitvector.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/powerset-impl.h"
                ,0x55,
                "bool wasm::analysis::FiniteIntPowersetLattice::join(Element &, const Element &) const"
               );
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    return intLattice.join(joinee, joiner);
  }